

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderLineStrip<ImPlot::GetterYs<int>,ImPlot::TransformerLogLin>
               (GetterYs<int> *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  double dVar6;
  ImPlotContext *pIVar7;
  ImPlotContext *pIVar8;
  int iVar9;
  int iVar10;
  ImPlotContext *gp;
  float fVar11;
  float fVar12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLogLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar7 = GImPlot;
  pIVar5 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar5->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar9 = getter->Count;
    local_48 = iVar9 + -1;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    iVar9 = *(int *)((long)getter->Ys +
                    (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar6 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar5->XAxis).Range.Min);
    pIVar5 = pIVar7->CurrentPlot;
    dVar3 = (pIVar5->XAxis).Range.Min;
    iVar10 = transformer->YAxis;
    local_3c.y = (float)(((double)iVar9 - pIVar5->YAxis[iVar10].Range.Min) * pIVar7->My[iVar10] +
                        (double)pIVar7->PixelRange[iVar10].Min.y);
    local_3c.x = (float)((((double)(float)(dVar6 / pIVar7->LogDenX) *
                           ((pIVar5->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar7->Mx +
                        (double)pIVar7->PixelRange[iVar10].Min.x);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterYs<int>,ImPlot::TransformerLogLin>>
              ((LineStripRenderer<ImPlot::GetterYs<int>,_ImPlot::TransformerLogLin> *)local_58,
               local_60,&pIVar5->PlotRect);
  }
  else {
    iVar9 = getter->Count;
    iVar9 = *(int *)((long)getter->Ys +
                    (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride);
    dVar6 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar5->XAxis).Range.Min);
    pIVar5 = pIVar7->CurrentPlot;
    dVar3 = (pIVar5->XAxis).Range.Min;
    iVar10 = transformer->YAxis;
    local_58._4_4_ =
         (float)(((double)iVar9 - pIVar5->YAxis[iVar10].Range.Min) * pIVar7->My[iVar10] +
                (double)pIVar7->PixelRange[iVar10].Min.y);
    local_58._0_4_ =
         (float)((((double)(float)(dVar6 / pIVar7->LogDenX) * ((pIVar5->XAxis).Range.Max - dVar3) +
                  dVar3) - dVar3) * pIVar7->Mx + (double)pIVar7->PixelRange[iVar10].Min.x);
    iVar9 = getter->Count;
    if (1 < iVar9) {
      iVar10 = 1;
      do {
        pIVar8 = GImPlot;
        iVar9 = *(int *)((long)getter->Ys +
                        (long)(((getter->Offset + iVar10) % iVar9 + iVar9) % iVar9) *
                        (long)getter->Stride);
        dVar6 = log10(((double)iVar10 * getter->XScale + getter->X0) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar5 = pIVar8->CurrentPlot;
        dVar3 = (pIVar5->XAxis).Range.Min;
        iVar4 = transformer->YAxis;
        fVar11 = (float)((((double)(float)(dVar6 / pIVar8->LogDenX) *
                           ((pIVar5->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar8->Mx +
                        (double)pIVar8->PixelRange[iVar4].Min.x);
        fVar12 = (float)(((double)iVar9 - pIVar5->YAxis[iVar4].Range.Min) * pIVar8->My[iVar4] +
                        (double)pIVar8->PixelRange[iVar4].Min.y);
        local_68.y = fVar12;
        local_68.x = fVar11;
        pIVar5 = pIVar7->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar12 <= (float)local_58._4_4_) {
          fVar2 = fVar12;
        }
        if ((fVar2 < (pIVar5->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar12 <= (float)local_58._4_4_) & (uint)fVar12 |
                           local_58._4_4_ & -(uint)(fVar12 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar5->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (fVar11 <= (float)local_58._0_4_) {
            fVar2 = fVar11;
          }
          if ((fVar2 < (pIVar5->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(fVar11 <= (float)local_58._0_4_) & (uint)fVar11 |
                             local_58._0_4_ & -(uint)(fVar11 <= (float)local_58._0_4_)),
             (pIVar5->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar5->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,col,line_weight);
          }
        }
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
        iVar10 = iVar10 + 1;
        iVar9 = getter->Count;
      } while (iVar10 < iVar9);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}